

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

void __thiscall
Fl_Text_Selection::update(Fl_Text_Selection *this,int pos,int nDeleted,int nInserted)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((this->mSelected == true) && (iVar2 = this->mEnd, pos <= iVar2)) {
    iVar3 = nDeleted + pos;
    iVar1 = this->mStart;
    if (iVar3 <= iVar1) {
      this->mStart = iVar1 + (nInserted - nDeleted);
      this->mEnd = iVar2 + (nInserted - nDeleted);
      return;
    }
    if (iVar3 < iVar2 || iVar1 < pos) {
      if (pos <= iVar1 && iVar3 < iVar2) {
        this->mStart = pos;
        this->mEnd = (nInserted - nDeleted) + iVar2;
        return;
      }
      if (iVar2 <= pos) {
        return;
      }
      iVar2 = iVar2 + (nInserted - nDeleted);
      this->mEnd = iVar2;
      if (iVar1 < iVar2) {
        return;
      }
    }
    else {
      this->mStart = pos;
      this->mEnd = pos;
    }
    this->mSelected = false;
  }
  return;
}

Assistant:

void Fl_Text_Selection::update(int pos, int nDeleted, int nInserted)
{
  if (!mSelected || pos > mEnd)
    return;
  if (pos + nDeleted <= mStart) {
    mStart += nInserted - nDeleted;
    mEnd += nInserted - nDeleted;
  } else if (pos <= mStart && pos + nDeleted >= mEnd) {
    mStart = pos;
    mEnd = pos;
    mSelected = 0;
  } else if (pos <= mStart && pos + nDeleted < mEnd) {
    mStart = pos;
    mEnd = nInserted + mEnd - nDeleted;
  } else if (pos < mEnd) {
    mEnd += nInserted - nDeleted;
    if (mEnd <= mStart)
      mSelected = 0;
  }
}